

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.h
# Opt level: O3

dim_t lf::base::internal::DimensionImpl(RefElType type)

{
  runtime_error *this;
  
  if ((byte)(type - kPoint) < 4) {
    return *(dim_t *)(&DAT_00386120 + (ulong)(byte)(type - kPoint) * 4);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"RefEl::Dimension() not implemented for this RefEl type.");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

constexpr dim_t DimensionImpl(RefElType type) {
  switch (type) {
    case RefElType::kPoint:
      return 0;
    case RefElType::kSegment:
      return 1;
    case RefElType::kTria:
    case RefElType::kQuad:
      return 2;
    default:
      throw std::runtime_error(
          "RefEl::Dimension() not implemented for this RefEl type.");
  }
}